

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O0

void Ptex::v2_4::(anonymous_namespace)::Apply<unsigned_char,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  int iVar1;
  float *in_RDX;
  Res *in_RDI;
  uchar *pRowEnd;
  float *kup;
  uchar *pEnd;
  uchar *p;
  float *kvp;
  int rowskip;
  int datalen;
  int rowlen;
  float *rowResult;
  float weight;
  float *val;
  float *in_stack_ffffffffffffff88;
  VecMult<unsigned_char,_4> *in_stack_ffffffffffffff90;
  VecAccum<float,_4> local_63;
  VecAccum<unsigned_char,_4> local_62;
  VecMult<unsigned_char,_4> local_61;
  uchar *local_60;
  long local_58;
  uchar *local_50;
  uchar *local_48;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  float *local_18;
  Res *local_8;
  
  local_28 = &stack0xffffffffffffff88;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_2c = Res::u(in_RDI);
  local_2c = local_2c * 4;
  local_30 = *(int *)(local_8 + 6) * 4;
  local_34 = local_2c + *(int *)(local_8 + 6) * -4;
  local_40 = *(long *)(local_8 + 0x10);
  weight = *(float *)(local_8 + 4);
  iVar1 = Res::u(local_8);
  local_48 = (uchar *)((long)local_18 + (long)(((int)weight * iVar1 + *(int *)(local_8 + 2)) * 4));
  local_50 = local_48 + *(int *)(local_8 + 8) * local_2c;
  val = local_18;
  for (; local_48 != local_50; local_48 = local_48 + local_34) {
    local_58 = *(long *)(local_8 + 0xc);
    local_60 = local_48 + local_30;
    PtexUtils::VecMult<unsigned_char,_4>::VecMult(&local_61);
    local_58 = local_58 + 4;
    PtexUtils::VecMult<unsigned_char,_4>::operator()
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(uchar *)val,weight);
    while (local_48 = local_48 + 4, local_48 != local_60) {
      PtexUtils::VecAccum<unsigned_char,_4>::VecAccum(&local_62);
      local_58 = local_58 + 4;
      PtexUtils::VecAccum<unsigned_char,_4>::operator()
                ((VecAccum<unsigned_char,_4> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (uchar *)val,weight);
    }
    PtexUtils::VecAccum<float,_4>::VecAccum(&local_63);
    local_40 = local_40 + 4;
    PtexUtils::VecAccum<float,_4>::operator()
              ((VecAccum<float,_4> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,val,weight)
    ;
  }
  return;
}

Assistant:

void Apply(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nChan;
        int datalen = k.uw * nChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }